

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign96.c
# Opt level: O1

size_t bign96Sign_deep(size_t n,size_t f_deep,size_t ec_d,size_t ec_deep)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  sVar1 = beltHash_keep();
  sVar2 = ecMulA_deep(n,ec_d,ec_deep,n);
  sVar3 = zzMul_deep(2,n);
  sVar4 = zzMod_deep(n + 2,n);
  sVar1 = utilMax(4,sVar1,sVar2,sVar3,sVar4);
  return sVar1 + n * 0x18 + 0x20;
}

Assistant:

static size_t bign96Sign_deep(size_t n, size_t f_deep, size_t ec_d,
	size_t ec_deep)
{
	return O_OF_W(3 * n + 2 * W_OF_O(13)) +
		utilMax(4,
			beltHash_keep(),
			ecMulA_deep(n, ec_d, ec_deep, n),
			zzMul_deep(W_OF_O(13), n),
			zzMod_deep(n + W_OF_O(13), n));
}